

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O1

bool __thiscall
Diligent::FramebufferCache::FramebufferCacheKey::UsesImageView
          (FramebufferCacheKey *this,VkImageView View)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  uVar2 = this->NumRenderTargets;
  bVar5 = uVar2 != 0;
  if (bVar5) {
    if (this->RTVs[0] != View) {
      lVar4 = 0;
      do {
        if (uVar2 - 1 == (int)lVar4) goto LAB_00200a6d;
        lVar1 = lVar4 + 1;
        lVar3 = lVar4 + 1;
        lVar4 = lVar1;
      } while (this->RTVs[lVar3] != View);
      bVar5 = (uint)lVar1 < uVar2;
    }
    if (bVar5) {
      return true;
    }
  }
LAB_00200a6d:
  return this->ShadingRate == View || this->DSV == View;
}

Assistant:

bool FramebufferCache::FramebufferCacheKey::UsesImageView(VkImageView View) const
{
    for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
    {
        if (RTVs[rt] == View)
            return true;
    }
    return DSV == View || ShadingRate == View;
}